

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O1

void __thiscall
FSoftwareRenderer::Precache
          (FSoftwareRenderer *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  ushort uVar1;
  Node *pNVar2;
  PClassActor *pPVar3;
  bool bVar4;
  Node *pNVar5;
  uint uVar6;
  spriteframe_t *psVar7;
  FSoftwareRenderer *this_00;
  uint uVar8;
  uint uVar9;
  IPair *pIVar10;
  FTexture *tex;
  IPair *pIVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar6 = sprites.Count;
  uVar16 = (ulong)sprites.Count;
  this_00 = (FSoftwareRenderer *)operator_new__(uVar16);
  uVar8 = 0;
  pIVar10 = (IPair *)0x0;
  memset(this_00,0,uVar16);
  uVar9 = actorhitlist->Size;
  pNVar2 = actorhitlist->Nodes;
  do {
    if (uVar8 < uVar9) {
      pNVar5 = pNVar2 + uVar8;
      do {
        pIVar11 = &pNVar5->Pair;
        uVar8 = uVar8 + 1;
        if (*(long *)((long)(pIVar11 + -1) + 8) != 1) {
          bVar4 = true;
          pIVar10 = pIVar11;
          goto LAB_002ccd8e;
        }
        pNVar5 = (Node *)(pIVar11 + 1);
      } while (uVar8 != uVar9);
      bVar4 = false;
      uVar8 = uVar9;
    }
    else {
      bVar4 = false;
    }
LAB_002ccd8e:
    if (!bVar4) {
      if (-1 < (int)(uVar6 - 1)) {
        uVar16 = (ulong)(uVar6 - 1);
        do {
          if ((*(char *)((long)&(this_00->super_FRenderer)._vptr_FRenderer + uVar16) != '\0') &&
             (sprites.Array[uVar16].numframes != '\0')) {
            uVar9 = 0;
            lVar12 = 8;
            do {
              psVar7 = SpriteFrames.Array;
              uVar1 = sprites.Array[uVar16].spriteframes;
              lVar13 = 0;
              do {
                lVar14 = (long)*(int *)((long)&psVar7->Texture[lVar13 + -2].texnum +
                                       (ulong)((uint)uVar1 * 0x50) + lVar12);
                if (0 < lVar14) {
                  texhitlist[lVar14] = '\b';
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0x10);
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 + 0x50;
            } while (uVar9 < sprites.Array[uVar16].numframes);
          }
          bVar4 = 0 < (long)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar4);
      }
      operator_delete__(this_00);
      uVar16 = (ulong)(int)TexMan.Textures.Count;
      if (0 < (long)uVar16) {
        lVar12 = uVar16 << 4;
        do {
          uVar15 = uVar16 - 1;
          if (uVar15 < TexMan.Textures.Count) {
            tex = *(FTexture **)((long)&TexMan.Textures.Array[-1].Texture + lVar12);
          }
          else {
            tex = (FTexture *)0x0;
          }
          PrecacheTexture(this_00,tex,(uint)texhitlist[uVar15]);
          bVar4 = 1 < (long)uVar16;
          lVar12 = lVar12 + -0x10;
          uVar16 = uVar15;
        } while (bVar4);
      }
      return;
    }
    pPVar3 = pIVar10->Key;
    if (0 < pPVar3->NumOwnedStates) {
      lVar12 = 0x10;
      lVar13 = 0;
      do {
        *(undefined1 *)
         ((long)&(this_00->super_FRenderer)._vptr_FRenderer +
         (long)*(int *)((long)&pPVar3->OwnedStates->NextState + lVar12)) = 1;
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x28;
      } while (lVar13 < pPVar3->NumOwnedStates);
    }
  } while( true );
}

Assistant:

void FSoftwareRenderer::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	BYTE *spritelist = new BYTE[sprites.Size()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;

	memset(spritelist, 0, sprites.Size());

	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite] = true;
		}
	}

	// Precache textures (and sprites).

	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i])
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						texhitlist[pic.GetIndex()] = FTextureManager::HIT_Sprite;
					}
				}
			}
		}
	}
	delete[] spritelist;

	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		PrecacheTexture(TexMan.ByIndex(i), texhitlist[i]);
	}
}